

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O0

void __thiscall Potassco::RuleBuilder::startBody(RuleBuilder *this,Body_t bt,Weight_t bnd)

{
  uint uVar1;
  uint32_t uVar2;
  Rule *m;
  Rule *in_RDI;
  Rule *r;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  RuleBuilder *in_stack_ffffffffffffffe0;
  Body_t local_4;
  
  m = unfreeze(in_stack_ffffffffffffffe0,SUB81((ulong)in_RDI >> 0x38,0));
  if ((m->body).mend == 0) {
    uVar1 = Body_t::operator_cast_to_unsigned_int(&local_4);
    if (uVar1 != 0) {
      m = anon_unknown_20::push<int>
                    ((MemoryRegion *)m,in_RDI,
                     (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    uVar1 = *(uint *)m & 0x7fffffff;
    Body_t::operator_cast_to_unsigned_int(&local_4);
    Rule::Span::init(&m->body,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  else {
    uVar2 = Rule::Span::len(&m->body);
    if (uVar2 != 0) {
      fail(-1,"void Potassco::RuleBuilder::startBody(Body_t, Weight_t)",0x91,"r->body.len() == 0",
           "Invalid second call to startBody()",0);
    }
  }
  return;
}

Assistant:

void RuleBuilder::startBody(Body_t bt, Weight_t bnd) {
	Rule* r = unfreeze(true);
	if (!r->body.mend) {
		if (bt != Body_t::Normal) { r = push(mem_, r, bnd); }
		r->body.init(r->top, bt);
	}
	else {
		POTASSCO_ASSERT(r->body.len() == 0, "Invalid second call to startBody()");
	}
}